

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O2

void interpolative_internal::write_center_mid(bit_stream *os,uint64_t val,uint64_t u)

{
  uint64_t uVar1;
  size_t bits;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint32_t val_00;
  
  if (u == 1) {
    return;
  }
  bits = LZCOUNT(u - 1) ^ 0x3f;
  lVar3 = 2L << (bits & 0x3f);
  uVar2 = (u - (u * 2 - lVar3 >> 1)) + val;
  uVar1 = 0;
  if (u < uVar2) {
    uVar1 = u;
  }
  uVar4 = (ulong)(uint)((int)lVar3 - (int)u);
  uVar2 = uVar2 - uVar1;
  if (uVar4 < uVar2) {
    uVar2 = (uVar4 - 1) + uVar2;
    bit_stream::put_int(os,(uint32_t)(uVar2 >> 1),bits);
    val_00 = (uint)uVar2 & 1;
    bits = 1;
  }
  else {
    val_00 = (int)uVar2 - 1;
  }
  bit_stream::put_int(os,val_00,bits);
  return;
}

Assistant:

static inline void write_center_mid(
        bit_stream& os, uint64_t val, uint64_t u)
    {
        if (u == 1)
            return;
        auto b = bits::hi(u - 1) + 1ULL;
        uint64_t d = 2ULL * u - (1ULL << b);
        val = val + (u - (d >> 1));
        if (val > u)
            val -= u;
        uint32_t m = (1ULL << b) - u;
        if (val <= m) {
            os.put_int(val - 1ULL, b - 1ULL);
        } else {
            val += m;
            os.put_int((val - 1ULL) >> 1ULL, b - 1ULL);
            os.put_int((val - 1ULL) & 1ULL, 1ULL);
        }
    }